

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

ScriptBuilder * __thiscall
cfd::core::ScriptBuilder::AppendString(ScriptBuilder *this,string *message)

{
  uint __val;
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint __len;
  string str;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  ByteData local_48;
  
  bVar2 = ScriptOperator::IsValid(message);
  if (bVar2) {
    ScriptOperator::Get((ScriptOperator *)local_78,message);
    AppendOperator(this,(ScriptOperator *)local_78);
    local_78._0_8_ = &PTR__ScriptOperator_00722da0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_allocated_capacity == &local_58) {
      return this;
    }
  }
  else {
    if (2 < message->_M_string_length) {
      ::std::__cxx11::string::substr((ulong)local_78,(ulong)message);
      iVar3 = ::std::__cxx11::string::compare(local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_);
      }
      if (iVar3 == 0) {
        ::std::__cxx11::string::substr((ulong)local_78,(ulong)message);
        ByteData::ByteData(&local_48,(string *)local_78);
        AppendData(this,&local_48);
        if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_68._M_allocated_capacity = local_78._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._0_8_ == &local_68) {
          return this;
        }
        goto LAB_00309b3a;
      }
    }
    uVar4 = atoi((message->_M_dataplus)._M_p);
    if (uVar4 != 0) {
      __val = -uVar4;
      if (0 < (int)uVar4) {
        __val = uVar4;
      }
      __len = 1;
      if (9 < __val) {
        uVar6 = (ulong)__val;
        uVar1 = 4;
        do {
          __len = uVar1;
          uVar5 = (uint)uVar6;
          if (uVar5 < 100) {
            __len = __len - 2;
            goto LAB_00309a7e;
          }
          if (uVar5 < 1000) {
            __len = __len - 1;
            goto LAB_00309a7e;
          }
          if (uVar5 < 10000) goto LAB_00309a7e;
          uVar6 = uVar6 / 10000;
          uVar1 = __len + 4;
        } while (99999 < uVar5);
        __len = __len + 1;
      }
LAB_00309a7e:
      local_78._0_8_ = &local_68;
      ::std::__cxx11::string::_M_construct((ulong)local_78,(char)__len - (char)((int)uVar4 >> 0x1f))
      ;
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_78._0_8_ + (ulong)(uVar4 >> 0x1f)),__len,__val);
      bVar2 = true;
      if (((pointer)local_78._8_8_ == (pointer)message->_M_string_length) &&
         (((pointer)local_78._8_8_ == (pointer)0x0 ||
          (iVar3 = bcmp((void *)local_78._0_8_,(message->_M_dataplus)._M_p,local_78._8_8_),
          iVar3 == 0)))) {
        local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(long)(int)uVar4;
        AppendData(this,(int64_t *)&local_48);
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_);
      }
      if (!bVar2) {
        return this;
      }
    }
    ByteData::ByteData((ByteData *)local_78,message);
    AppendData(this,(ByteData *)local_78);
    local_68._M_allocated_capacity = local_78._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return this;
    }
  }
LAB_00309b3a:
  operator_delete((void *)local_68._M_allocated_capacity);
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendString(const std::string& message) {
  if (ScriptOperator::IsValid(message)) {
    return AppendOperator(ScriptOperator::Get(message));
  } else if ((message.length() > 2) && (message.substr(0, 2) == "0x")) {
    // to hex
    return AppendData(ByteData(message.substr(2)));
  } else {
    if (std::atoi(message.c_str()) != 0) {  // check number
      int int_value = std::atoi(message.c_str());
      std::string str = std::to_string(int_value);
      if (str == message) {
        return AppendData(static_cast<int64_t>(int_value));
      }
    }
    // hex string check (force)
    return AppendData(ByteData(message));
  }
}